

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Matrix<float,_2,_2>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Matrix<float,_2,_2>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  long lVar1;
  int compNdx;
  long lVar2;
  IVal local_58;
  
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    if ((iargs->b->m_lo <= (double)(int)lVar2) && ((double)(int)lVar2 <= iargs->b->m_hi)) {
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
                (&local_58,__return_storage_ptr__,
                 (IVal *)(&(iargs->a->m_data).m_data[0].m_data[0].m_hasNaN + lVar1));
      __return_storage_ptr__->m_data[1].m_lo = local_58.m_data[1].m_lo;
      __return_storage_ptr__->m_data[1].m_hi = local_58.m_data[1].m_hi;
      __return_storage_ptr__->m_data[0].m_hi = local_58.m_data[0].m_hi;
      __return_storage_ptr__->m_data[1].m_hasNaN = local_58.m_data[1].m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = local_58.m_data[1]._1_7_;
      __return_storage_ptr__->m_data[0].m_hasNaN = local_58.m_data[0].m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = local_58.m_data[0]._1_7_;
      __return_storage_ptr__->m_data[0].m_lo = local_58.m_data[0].m_lo;
    }
    lVar1 = lVar1 + 0x30;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}